

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * lest::pluralise(text *word,int n)

{
  int in_EDX;
  string *in_RSI;
  string *in_RDI;
  string local_58 [32];
  string local_38 [8];
  char *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  if (in_EDX != 1) {
    std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::__cxx11::string::string(local_38,local_58);
  }
  else {
    std::__cxx11::string::string(local_38,in_RSI);
  }
  std::__cxx11::string::string(in_RDI,local_38);
  std::__cxx11::string::~string(local_38);
  if (in_EDX != 1) {
    std::__cxx11::string::~string(local_58);
  }
  return in_RDI;
}

Assistant:

inline text pluralise( text word,int n )
{
    return n == 1 ? word : word + "s";
}